

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorLinearDriveline::IntStateGather
          (ChLinkMotorLinearDriveline *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,
          double *T)

{
  element_type *peVar1;
  
  (**(code **)(**(long **)&(this->super_ChLinkMotorLinear).field_0x278 + 0xd8))();
  peVar1 = (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1b])
            (peVar1,(ulong)(off_x + 1),x,(ulong)(off_v + 1),v,T);
  peVar1 = (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1b])
            (peVar1,(ulong)(off_x + 2),x,(ulong)(off_v + 2),v,T);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::IntStateGather(const unsigned int off_x,
                                  ChState& x,
                                  const unsigned int off_v,
                                  ChStateDelta& v,
                                  double& T) {
    // First, inherit to parent class
    ChLinkMotorLinear::IntStateGather(off_x, x, off_v, v, T);

    innershaft1lin->IntStateGather(off_x + 0, x, off_v + 0, v, T);
    innershaft2lin->IntStateGather(off_x + 1, x, off_v + 1, v, T);
    innershaft2rot->IntStateGather(off_x + 2, x, off_v + 2, v, T);
}